

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FrontFacingCase::iterate(FrontFacingCase *this)

{
  TestLog *log;
  RenderContext *pRVar1;
  bool bVar2;
  int x_1;
  int iVar3;
  int x_00;
  int y_00;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ulong uVar6;
  TestError *this_00;
  char *description;
  int y;
  int x;
  int iVar7;
  allocator<char> local_2b9;
  long local_2b8;
  RGBA threshold;
  Surface refImg;
  deUint16 indicesCW [6];
  deUint16 indicesCCW [6];
  undefined1 local_270 [40];
  TestLog *local_248;
  Surface testImg;
  float positions [16];
  VertexArrayBinding posBinding;
  Random rnd;
  ShaderProgram program;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2b8 = CONCAT44(extraout_var,iVar3);
  deRandom_init(&rnd.m_rnd,0x89f2c);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar5->m_width;
  if (0x3f < pRVar5->m_width) {
    iVar3 = 0x40;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = 0x40;
  if (pRVar5->m_height < 0x40) {
    iVar7 = pRVar5->m_height;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  x_00 = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar5->m_width - iVar3);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  y_00 = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar5->m_height - iVar7);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010101;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  posBinding.binding.type = (Type)tcu::PixelFormat::getColorThreshold(&pRVar5->m_pixelFormat);
  threshold = tcu::operator+((RGBA *)&program,(RGBA *)&posBinding);
  tcu::Surface::Surface(&testImg,iVar3,iVar7);
  tcu::Surface::Surface(&refImg,iVar3,iVar7);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)positions,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)indicesCCW);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\tif (gl_FrontFacing)\n\t\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\to_color = vec4(0.0, 0.0, 1.0, 1.0);\n}\n"
             ,(allocator<char> *)indicesCW);
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)positions,(string *)local_270);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)positions);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&posBinding,"Compile failed",(allocator<char> *)positions);
    tcu::TestError::TestError(this_00,(string *)&posBinding);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  positions[0xc] = 1.0;
  positions[0xd] = -1.0;
  positions[0xe] = 0.0;
  positions[0xf] = 1.0;
  positions[8] = 1.0;
  positions[9] = 1.0;
  positions[10] = 0.0;
  positions[0xb] = 1.0;
  positions[4] = -1.0;
  positions[5] = -1.0;
  positions[6] = 0.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = 1.0;
  positions[2] = 0.0;
  positions[3] = 1.0;
  indicesCCW[0] = 0;
  indicesCCW[1] = 1;
  indicesCCW[2] = 2;
  indicesCCW[3] = 2;
  indicesCCW[4] = 1;
  indicesCCW[5] = 3;
  indicesCW[0] = 2;
  indicesCW[1] = 1;
  indicesCW[2] = 0;
  indicesCW[3] = 3;
  indicesCW[4] = 1;
  indicesCW[5] = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_270,"a_position",&local_2b9);
  local_248 = log;
  glu::va::Float(&posBinding,(string *)local_270,4,4,0,positions);
  std::__cxx11::string::~string((string *)local_270);
  (**(code **)(local_2b8 + 0x1680))(program.m_program.m_program);
  iVar4 = (int)((long)iVar3 / 2);
  (**(code **)(local_2b8 + 0x1a00))(x_00,y_00,(long)iVar3 / 2 & 0xffffffff,iVar7);
  local_270._0_4_ = R;
  local_270._4_4_ = UNORM_INT32;
  local_270._8_4_ = INDEXTYPE_UINT16;
  local_270._16_8_ = indicesCCW;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
            &posBinding,(PrimitiveList *)local_270,(DrawUtilCallback *)0x0);
  (**(code **)(local_2b8 + 0x1a00))(x_00 + iVar4,y_00,iVar3 - iVar4,iVar7);
  local_270._0_4_ = R;
  local_270._4_4_ = UNORM_INT32;
  local_270._8_4_ = INDEXTYPE_UINT16;
  local_270._16_8_ = indicesCW;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
            &posBinding,(PrimitiveList *)local_270,(DrawUtilCallback *)0x0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_270,&testImg);
  glu::readPixels(pRVar1,x_00,y_00,(PixelBufferAccess *)local_270);
  err = (**(code **)(local_2b8 + 0x800))();
  glu::checkError(err,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x29a);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  for (iVar3 = 0; iVar3 < refImg.m_height; iVar3 = iVar3 + 1) {
    for (iVar7 = 0; uVar6 = (long)refImg.m_width / 2 & 0xffffffff,
        iVar7 < (int)((long)refImg.m_width / 2); iVar7 = iVar7 + 1) {
      *(undefined4 *)((long)refImg.m_pixels.m_ptr + (long)(refImg.m_width * iVar3 + iVar7) * 4) =
           0xff00ff00;
    }
    while (iVar7 = (int)uVar6, iVar7 < refImg.m_width) {
      *(undefined4 *)((long)refImg.m_pixels.m_ptr + (long)(refImg.m_width * iVar3 + iVar7) * 4) =
           0xffff0000;
      uVar6 = (ulong)(iVar7 + 1);
    }
  }
  bVar2 = tcu::pixelThresholdCompare
                    (local_248,"Result","Image comparison result",&refImg,&testImg,&threshold,
                     COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,description
            );
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::Surface::~Surface(&refImg);
  tcu::Surface::~Surface(&testImg);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		// Test case renders two adjecent quads, where left is has front-facing
		// triagles and right back-facing. Color is selected based on gl_FrontFacing
		// value.

		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(0x89f2c);
		const int				width		= de::min(64, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(64, m_context.getRenderTarget().getHeight());
		const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
		const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_FrontFacing)\n"
			"		o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		o_color = vec4(0.0, 0.0, 1.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, 0.0f, 1.0f,
				-1.0f, -1.0f, 0.0f, 1.0f,
				 1.0f,  1.0f, 0.0f, 1.0f,
				 1.0f, -1.0f, 0.0f, 1.0f
			};
			const deUint16 indicesCCW[]	= { 0, 1, 2, 2, 1, 3 };
			const deUint16 indicesCW[]	= { 2, 1, 0, 3, 1, 2 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			gl.viewport(viewportX, viewportY, width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCCW), &indicesCCW[0]));

			gl.viewport(viewportX + width/2, viewportY, width-width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCW), &indicesCW[0]));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth()/2; x++)
				refImg.setPixel(x, y, tcu::RGBA::green());

			for (int x = refImg.getWidth()/2; x < refImg.getWidth(); x++)
				refImg.setPixel(x, y, tcu::RGBA::blue());
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}